

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.hpp
# Opt level: O1

int __thiscall
actorpp::detail::ActorImpl::
wait<std::vector<unsigned_char,std::allocator<unsigned_char>>,actorpp::CloseReason>
          (ActorImpl *this,Channel<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *c,
          Channel<actorpp::CloseReason> *c_1)

{
  element_type *peVar1;
  element_type *peVar2;
  int iVar3;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_38;
  
  local_38._M_owns = false;
  local_38._M_device = &this->mut;
  std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  while( true ) {
    peVar1 = (c->impl).
             super___shared_ptr<actorpp::detail::ChannelImpl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    iVar3 = 0;
    if (((iterator *)
        ((long)&(peVar1->elements).c.
                super__Deque_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl + 0x30))->_M_cur ==
        ((iterator *)
        ((long)&(peVar1->elements).c.
                super__Deque_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl + 0x10))->_M_cur) {
      peVar2 = (c_1->impl).
               super___shared_ptr<actorpp::detail::ChannelImpl<actorpp::CloseReason>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      iVar3 = (uint)(((iterator *)
                     ((long)&(peVar2->elements).c.
                             super__Deque_base<actorpp::CloseReason,_std::allocator<actorpp::CloseReason>_>
                             ._M_impl + 0x30))->_M_cur !=
                    ((iterator *)
                    ((long)&(peVar2->elements).c.
                            super__Deque_base<actorpp::CloseReason,_std::allocator<actorpp::CloseReason>_>
                            ._M_impl + 0x10))->_M_cur) * 2 + -1;
    }
    if (iVar3 != -1) break;
    std::condition_variable::wait((unique_lock *)&this->cv);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  return iVar3;
}

Assistant:

int wait(Channel<T> &...c) {
    std::unique_lock<std::mutex> lock(mut);
    int i;
    cv.wait(lock,
            [&]() { return (i = detail::readable_channel(0, c...)) != -1; });
    return i;
  }